

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.c
# Opt level: O0

void save_png(gdImagePtr im,char *filename)

{
  FILE *__stream;
  FILE *fp;
  char *filename_local;
  gdImagePtr im_local;
  
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Can\'t save png image %s\n",filename);
  }
  else {
    printf("No PNG support. Cannot save image.\n");
    fclose(__stream);
  }
  return;
}

Assistant:

void save_png(gdImagePtr im, const char *filename)
{
	FILE *fp;
	fp = fopen(filename, "wb");
	if (!fp) {
		fprintf(stderr, "Can't save png image %s\n", filename);
		return;
	}
#ifdef HAVE_LIBPNG
	gdImagePng(im, fp);
#else
	printf("No PNG support. Cannot save image.\n");
#endif
	fclose(fp);
}